

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::get(MutableCodePointTrie *this,UChar32 c)

{
  uint uVar1;
  uint32_t *puVar2;
  
  if ((uint)c < 0x110000) {
    if (c < this->highStart) {
      uVar1 = (uint)c >> 4;
      if (this->flags[uVar1] == '\0') {
        puVar2 = (uint32_t *)((ulong)(uVar1 << 2) + (long)this->index);
      }
      else {
        puVar2 = this->data + ((c & 0xfU) + this->index[uVar1]);
      }
    }
    else {
      puVar2 = &this->highValue;
    }
  }
  else {
    puVar2 = &this->errorValue;
  }
  return *puVar2;
}

Assistant:

uint32_t MutableCodePointTrie::get(UChar32 c) const {
    if ((uint32_t)c > MAX_UNICODE) {
        return errorValue;
    }
    if (c >= highStart) {
        return highValue;
    }
    int32_t i = c >> UCPTRIE_SHIFT_3;
    if (flags[i] == ALL_SAME) {
        return index[i];
    } else {
        return data[index[i] + (c & UCPTRIE_SMALL_DATA_MASK)];
    }
}